

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_system.cpp
# Opt level: O2

void __thiscall
duckdb::FileHandle::FileHandle
          (FileHandle *this,FileSystem *file_system,string *path_p,FileOpenFlags flags)

{
  undefined8 uVar1;
  
  uVar1 = flags._8_8_;
  this->_vptr_FileHandle = (_func_int **)&PTR__FileHandle_027a6b50;
  this->file_system = file_system;
  ::std::__cxx11::string::string((string *)&this->path,(string *)path_p);
  (this->flags).flags = flags.flags;
  (this->flags).lock = (char)uVar1;
  (this->flags).compression = (char)((ulong)uVar1 >> 8);
  *(int6 *)&(this->flags).field_0xa = (int6)((ulong)uVar1 >> 0x10);
  return;
}

Assistant:

FileHandle::FileHandle(FileSystem &file_system, string path_p, FileOpenFlags flags)
    : file_system(file_system), path(std::move(path_p)), flags(flags) {
}